

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O2

char * toInternetFormat(char *name)

{
  size_t sVar1;
  char *ptr;
  char *__dest;
  long lVar2;
  char *pcVar3;
  int iVar4;
  int i;
  ulong uVar5;
  
  sVar1 = strlen(name);
  ptr = (char *)malloc(sVar1 + 2);
  __dest = (char *)malloc(sVar1 + 1);
  checkMalloc(ptr);
  checkMalloc(__dest);
  strcpy(__dest,name);
  sVar1 = strlen(__dest);
  if (__dest[sVar1 - 1] != '.') {
    sVar1 = strlen(__dest);
    (__dest + sVar1)[0] = '.';
    (__dest + sVar1)[1] = '\0';
  }
  uVar5 = 0;
  iVar4 = 0;
  pcVar3 = ptr;
  while( true ) {
    sVar1 = strlen(__dest);
    if (sVar1 <= uVar5) break;
    if (__dest[uVar5] == '.') {
      *pcVar3 = (char)uVar5 - (char)iVar4;
      lVar2 = (long)iVar4;
      if (lVar2 < (long)uVar5) {
        iVar4 = (int)uVar5;
      }
      iVar4 = iVar4 + 1;
      for (; pcVar3 = pcVar3 + 1, lVar2 < (long)uVar5; lVar2 = lVar2 + 1) {
        *pcVar3 = __dest[lVar2];
      }
    }
    uVar5 = uVar5 + 1;
  }
  *pcVar3 = '\0';
  free(__dest);
  return ptr;
}

Assistant:

char *toInternetFormat(char *name)
{
    char *result = (char *) malloc(strlen(name) + 2);
    char *domain = (char *) malloc(strlen(name) + 1);
    checkMalloc(result);
    checkMalloc(domain);

    strcpy(domain, name);
    char *dns = result;
    int lock = 0;

    // 尾部补 “.”
    if (domain[strlen((char *) domain) - 1] != '.')
        strcat((char *) domain, ".");

    for (int i = 0; i < strlen((char *) domain); i++)
    {
        if (domain[i] == '.')
        {
            *dns++ = i - lock;
            for (; lock < i; lock++)
            {
                *dns++ = domain[lock];
            }
            lock++;
        }
    }
    *dns++ = '\0';

    free(domain);

    return result;
}